

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  Column *pCVar1;
  ostream *poVar2;
  Column local_58;
  long local_28;
  size_t i;
  size_t indent_local;
  string *_string_local;
  ConsoleReporter *this_local;
  
  i = indent;
  indent_local = (size_t)_string;
  _string_local = (string *)this;
  local_28 = std::__cxx11::string::find((char *)_string,0x1ff7ee);
  if (local_28 == -1) {
    local_28 = 0;
  }
  else {
    local_28 = local_28 + 2;
  }
  poVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  clara::TextFlow::Column::Column(&local_58,(string *)indent_local);
  pCVar1 = clara::TextFlow::Column::indent(&local_58,i + local_28);
  pCVar1 = clara::TextFlow::Column::initialIndent(pCVar1,i);
  poVar2 = clara::TextFlow::operator<<(poVar2,pCVar1);
  std::operator<<(poVar2,'\n');
  clara::TextFlow::Column::~Column(&local_58);
  return;
}

Assistant:

void ConsoleReporter::printHeaderString(std::string const& _string, std::size_t indent) {
    std::size_t i = _string.find(": ");
    if (i != std::string::npos)
        i += 2;
    else
        i = 0;
    stream << Column(_string).indent(indent + i).initialIndent(indent) << '\n';
}